

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry *
NscBuildVectorConstant(CNscPStackEntry *px,CNscPStackEntry *py,CNscPStackEntry *pz)

{
  CNscPStackEntry *pCVar1;
  long in_RDX;
  CNscPStackEntry *in_RSI;
  long in_RDI;
  float fVar2;
  float z;
  float y;
  float x;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffc8;
  NscType in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pCVar1 = CNscContext::GetPStackEntry
                     ((CNscContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  if (in_RDI != 0) {
    CNscPStackEntry::GetFloat
              ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (in_RSI != (CNscPStackEntry *)0x0) {
    CNscPStackEntry::GetFloat
              ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (in_RDX == 0) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = CNscPStackEntry::GetFloat
                      ((CNscPStackEntry *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(fVar2,in_stack_ffffffffffffffd0),
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  CNscPStackEntry::PushConstantVector
            (in_RSI,(float)((ulong)in_RDX >> 0x20),(float)in_RDX,(float)((ulong)pCVar1 >> 0x20));
  CNscPStackEntry::SetType
            ((CNscPStackEntry *)CONCAT44(fVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc)
  ;
  return pCVar1;
}

Assistant:

YYSTYPE NscBuildVectorConstant (YYSTYPE px, YYSTYPE py, YYSTYPE pz)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// Get the x value
	//

	float x;
	if (px)
	{
		x = px ->GetFloat ();
		g_pCtx ->FreePStackEntry (px);
	}
	else
		x = 0;

	//
	// Get the y value
	//

	float y;
	if (py)
	{
		y = py ->GetFloat ();
		g_pCtx ->FreePStackEntry (py);
	}
	else
		y = 0;

	//
	// Get the z value
	//

	float z;
	if (pz)
	{
		z = pz ->GetFloat ();
		g_pCtx ->FreePStackEntry (pz);
	}
	else
		z = 0;

	//
	// Set the new value
	//

	pOut ->PushConstantVector (x, y, z);
	pOut ->SetType (NscType_Vector);
	return pOut;
}